

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(CodedOutputStream *this,uint64 value)

{
  uint8 *puVar1;
  int size;
  uint8 *end;
  uint8 *target;
  uint8 bytes [10];
  uint64 value_local;
  CodedOutputStream *this_local;
  
  bytes._2_8_ = value;
  puVar1 = WriteVarint64ToArray(value,(uint8 *)((long)&target + 6));
  WriteRaw(this,(void *)((long)&target + 6),(int)puVar1 - (int)(uint8 *)((long)&target + 6));
  return;
}

Assistant:

void CodedOutputStream::WriteVarint64SlowPath(uint64 value) {
  uint8 bytes[kMaxVarintBytes];
  uint8* target = &bytes[0];
  uint8* end = WriteVarint64ToArray(value, target);
  int size = end - target;
  WriteRaw(bytes, size);
}